

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  int i;
  long lVar1;
  char *format;
  int iVar2;
  double x;
  double y;
  int width;
  int local_20;
  int local_1c;
  
  if (_glfwInitialized == '\0') {
    iVar2 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (mode == 0x33003) {
      if (handle[0x41] == (GLFWwindow)(value != 0)) {
        return;
      }
      if (value == 0) {
        lVar1 = 0;
        do {
          if (handle[lVar1 + 0x5c] == (GLFWwindow)0x3) {
            handle[lVar1 + 0x5c] = (GLFWwindow)0x0;
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 != 8);
      }
      handle[0x41] = (GLFWwindow)(value != 0);
      return;
    }
    if (mode == 0x33002) {
      if (handle[0x40] == (GLFWwindow)(value != 0)) {
        return;
      }
      if (value == 0) {
        lVar1 = 100;
        do {
          if (handle[lVar1] == (GLFWwindow)0x3) {
            handle[lVar1] = (GLFWwindow)0x0;
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 != 0x1c1);
      }
      handle[0x40] = (GLFWwindow)(value != 0);
      return;
    }
    if (mode == 0x33001) {
      if (0xfffffffc < value - 0x34004U) {
        iVar2 = *(int *)(handle + 0x58);
        if (iVar2 == value) {
          return;
        }
        *(int *)(handle + 0x58) = value;
        if (_glfw.focusedWindow != (_GLFWwindow *)handle) {
          return;
        }
        x = _glfw.cursorPosX;
        y = _glfw.cursorPosY;
        if (iVar2 != 0x34003) {
          if (value != 0x34003) goto LAB_001b7bcb;
          _glfwPlatformGetCursorPos((_GLFWwindow *)handle,&_glfw.cursorPosX,&_glfw.cursorPosY);
          *(double *)(handle + 0x48) = _glfw.cursorPosX;
          *(double *)(handle + 0x50) = _glfw.cursorPosY;
          _glfwPlatformGetWindowSize((_GLFWwindow *)handle,&local_1c,&local_20);
          x = (double)(local_1c / 2);
          y = (double)(local_20 / 2);
        }
        _glfwPlatformSetCursorPos((_GLFWwindow *)handle,x,y);
LAB_001b7bcb:
        _glfwPlatformApplyCursorMode((_GLFWwindow *)handle);
        return;
      }
      format = "Invalid cursor mode";
    }
    else {
      format = "Invalid input mode";
    }
    iVar2 = 0x10003;
  }
  _glfwInputError(iVar2,format);
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
            setCursorMode(window, value);
            break;
        case GLFW_STICKY_KEYS:
            setStickyKeys(window, value ? GL_TRUE : GL_FALSE);
            break;
        case GLFW_STICKY_MOUSE_BUTTONS:
            setStickyMouseButtons(window, value ? GL_TRUE : GL_FALSE);
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode");
            break;
    }
}